

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O3

void merkle_tests::merkle_test_oneTx_block_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestOpts opts;
  unit_test_log_t *puVar3;
  ios_base *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  merkle_test_oneTx_block t;
  undefined8 in_stack_fffffffffffff8e8;
  undefined8 in_stack_fffffffffffff8f0;
  pointer in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 local_678 [112];
  ios_base local_608 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  undefined1 local_4d8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_680 = "";
  memset((ostringstream *)local_4d8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  local_360[0]._M_string_length = 0;
  local_360[0].field_2._M_local_buf[0] = '\0';
  local_678[0] = 0x22;
  local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,local_678,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4d8,"merkle_test_oneTx_block",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_360,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678);
  if ((undefined1 *)local_678._0_8_ != local_678 + 0x10) {
    operator_delete((void *)local_678._0_8_,local_678._16_8_ + 1);
  }
  local_698 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360[0]._M_dataplus._M_p;
  local_690 = local_360[0]._M_dataplus._M_p + local_360[0]._M_string_length;
  file.m_end = (iterator)0x107;
  file.m_begin = (iterator)&local_688;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_698,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
    operator_delete(local_360[0]._M_dataplus._M_p,
                    CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                             local_360[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base((ios_base *)(local_4d8 + 0x70));
  local_678._0_8_ = (pointer)0x0;
  local_678._8_8_ = 0;
  local_678._16_8_ = 0;
  local_678._24_4_ = 0x1010101;
  local_678[0x1c] = '\0';
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8f0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8e8;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8f8;
  opts.coins_db_in_memory = (bool)(char)in_stack_fffffffffffff900;
  opts.block_tree_db_in_memory = (bool)(char)((ulong)in_stack_fffffffffffff900 >> 8);
  opts.setup_net = (bool)(char)((ulong)in_stack_fffffffffffff900 >> 0x10);
  opts.setup_validation_interface = (bool)(char)((ulong)in_stack_fffffffffffff900 >> 0x18);
  opts.min_validation_cache = (bool)(char)((ulong)in_stack_fffffffffffff900 >> 0x20);
  opts._29_3_ = (int3)((ulong)in_stack_fffffffffffff900 >> 0x28);
  TestingSetup::TestingSetup((TestingSetup *)local_4d8,MAIN,opts);
  if ((pointer)local_678._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_678._0_8_,local_678._16_8_ - local_678._0_8_);
  }
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_6a0 = "";
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  paVar1 = &local_500.field_2;
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"merkle_test_oneTx_block",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p;
  local_6b0 = local_500._M_dataplus._M_p + local_500._M_string_length;
  file_00.m_end = (iterator)0x107;
  file_00.m_begin = (iterator)&local_6a8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6b8,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  std::ios_base::~ios_base(local_608);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_6c0 = "";
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"merkle_test_oneTx_block",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p;
  local_6d0 = local_500._M_dataplus._M_p + local_500._M_string_length;
  file_01.m_end = (iterator)0x107;
  file_01.m_begin = (iterator)&local_6c8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_6d8,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  this = local_608;
  std::ios_base::~ios_base(this);
  merkle_test_oneTx_block::test_method((merkle_test_oneTx_block *)this);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_6e0 = "";
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"merkle_test_oneTx_block",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p;
  local_6f0 = local_500._M_dataplus._M_p + local_500._M_string_length;
  file_02.m_end = (iterator)0x107;
  file_02.m_begin = (iterator)&local_6e8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_6f8,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  std::ios_base::~ios_base(local_608);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  memset((ostringstream *)local_678,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_678,"merkle_test_oneTx_block",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_678,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_500,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  file_03.m_end = (iterator)0x107;
  file_03.m_begin = &stack0xfffffffffffff8f8;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (puVar3,file_03,(size_t)&stack0xfffffffffffff8e8,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
  std::ios_base::~ios_base(local_608);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_4d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_oneTx_block)
{
    bool mutated = false;
    CBlock block;

    block.vtx.resize(1);
    CMutableTransaction mtx;
    mtx.nLockTime = 0;
    block.vtx[0] = MakeTransactionRef(std::move(mtx));
    uint256 root = BlockMerkleRoot(block, &mutated);
    BOOST_CHECK_EQUAL(root, block.vtx[0]->GetHash());
    BOOST_CHECK_EQUAL(mutated, false);
}